

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

int Acb_ComputeSuppCost(Vec_Int_t *vSupp,Vec_Int_t *vWeights,int iFirstDiv)

{
  int iVar1;
  int i;
  int iVar2;
  
  iVar2 = 0;
  for (i = 0; i < vSupp->nSize; i = i + 1) {
    iVar1 = Vec_IntEntry(vSupp,i);
    iVar1 = Abc_Lit2Var(iVar1);
    iVar1 = Vec_IntEntry(vWeights,iVar1 - iFirstDiv);
    iVar2 = iVar2 + iVar1;
  }
  return iVar2;
}

Assistant:

int Acb_ComputeSuppCost( Vec_Int_t * vSupp, Vec_Int_t * vWeights, int iFirstDiv )
{
    int i, Entry, Cost = 0;
    Vec_IntForEachEntry( vSupp, Entry, i )
        Cost += Vec_IntEntry( vWeights, Abc_Lit2Var(Entry) - iFirstDiv );
    return Cost;
}